

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall
t_rb_generator::generate_field_defns(t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  bool bVar1;
  e_req eVar2;
  t_rb_ofstream *ptVar3;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  t_type *field_type;
  t_const_value *field_value;
  string local_88;
  string local_68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_48;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_40;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  t_rb_ofstream *out_local;
  t_rb_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"FIELDS = {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_rb_ofstream::indent_up(out);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    local_40._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    local_48._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)out,",");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    generate_rdoc(this,out,&(*pptVar5)->super_t_doc);
    ptVar3 = t_rb_ofstream::indent(out);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_88,(string *)psVar6);
    t_oop_generator::upcase_string(&local_68,&this->super_t_oop_generator,&local_88);
    poVar4 = std::operator<<((ostream *)ptVar3,(string *)&local_68);
    std::operator<<(poVar4," => ");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    field_type = t_field::get_type(*pptVar5);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    field_value = t_field::get_value(*pptVar5);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    eVar2 = t_field::get_req(*pptVar5);
    generate_field_data(this,out,field_type,psVar6,field_value,eVar2 == T_OPTIONAL);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_rb_ofstream::indent_down(out);
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"def struct_fields; FIELDS; end");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_field_defns(t_rb_ofstream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out.indent() << "FIELDS = {" << endl;
  out.indent_up();
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (f_iter != fields.begin()) {
      out << "," << endl;
    }

    // generate the field docstrings within the FIELDS constant. no real better place...
    generate_rdoc(out, *f_iter);

    out.indent() << upcase_string((*f_iter)->get_name()) << " => ";

    generate_field_data(out,
                        (*f_iter)->get_type(),
                        (*f_iter)->get_name(),
                        (*f_iter)->get_value(),
                        (*f_iter)->get_req() == t_field::T_OPTIONAL);
  }
  out.indent_down();
  out << endl;
  out.indent() << "}" << endl << endl;

  out.indent() << "def struct_fields; FIELDS; end" << endl << endl;
}